

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  pointer pcVar1;
  char *pcVar2;
  cmGlobalGenerator *pcVar3;
  LinkClosure *pLVar4;
  bool bVar5;
  cmLinkImplementation *pcVar6;
  char *pcVar7;
  long *plVar8;
  size_type *psVar9;
  pointer item;
  long *plVar10;
  pointer pbVar11;
  string propagates;
  cmTargetSelectLinker tsl;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmTargetCollectLinkLanguages cll;
  string local_160;
  LinkClosure *local_140;
  undefined1 local_138 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  long *local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  cmTargetCollectLinkLanguages local_98;
  
  local_d0._M_allocated_capacity = (size_type)&uStack_a0;
  local_d0._8_8_ = 1;
  local_c0 = (long *)0x0;
  uStack_b8 = 0;
  local_b0 = 0x3f800000;
  local_a8 = 0;
  uStack_a0 = 0;
  pcVar6 = GetLinkImplementation(this,config);
  local_140 = lc;
  if (pcVar6 != (cmLinkImplementation *)0x0) {
    pbVar11 = (pcVar6->Languages).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar11 !=
        (pcVar6->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_98.Config._M_dataplus._M_p = (pointer)&local_d0;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_d0,pbVar11,&local_98);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               (pcVar6->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
              (&local_98,this,config,
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d0,this);
    pLVar4 = local_140;
    item = (pcVar6->super_cmLinkImplementationLibraries).Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_start;
    if (item != (pcVar6->super_cmLinkImplementationLibraries).Libraries.
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_finish) {
      do {
        cmTargetCollectLinkLanguages::Visit(&local_98,&item->super_cmLinkItem);
        item = item + 1;
      } while (item != (pcVar6->super_cmLinkImplementationLibraries).Libraries.
                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    }
    if (local_c0 != (long *)0x0) {
      plVar10 = local_c0;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pLVar4->Languages,(value_type *)(plVar10 + 1));
        plVar10 = (long *)*plVar10;
      } while (plVar10 != (long *)0x0);
    }
    pcVar1 = local_138 + 0x10;
    local_138._16_4_ = 0x5f534148;
    local_138._8_8_ = (cmGeneratorTarget *)0x7;
    local_138._20_4_ = 0x585843;
    local_138._0_8_ = pcVar1;
    pcVar7 = GetProperty(this,(string *)local_138);
    if ((pointer)local_138._0_8_ != pcVar1) {
      operator_delete((void *)local_138._0_8_,CONCAT44(local_138._20_4_,local_138._16_4_) + 1);
    }
    if (pcVar7 == (char *)0x0) {
      local_138._16_4_ = 0x4b4e494c;
      local_138._20_4_ = 0x4c5f5245;
      local_120._M_impl._0_7_ = 0x45474155474e41;
      local_138._8_8_ = (cmGeneratorTarget *)0xf;
      local_120._M_impl._7_1_ = '\0';
      local_138._0_8_ = pcVar1;
      pcVar7 = GetProperty(this,(string *)local_138);
      if ((pointer)local_138._0_8_ != pcVar1) {
        operator_delete((void *)local_138._0_8_,CONCAT44(local_138._20_4_,local_138._16_4_) + 1);
      }
      if (pcVar7 == (char *)0x0) {
        local_120._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_120._M_impl.super__Rb_tree_header._M_header;
        local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
        local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
        pcVar3 = this->LocalGenerator->GlobalGenerator;
        local_138._16_4_ = SUB84(pcVar3,0);
        local_138._20_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
        pbVar11 = (pcVar6->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_138._8_8_ = this;
        local_120._M_impl.super__Rb_tree_header._M_header._M_right =
             local_120._M_impl.super__Rb_tree_header._M_header._M_left;
        if (pbVar11 !=
            (pcVar6->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            cmTargetSelectLinker::Consider
                      ((cmTargetSelectLinker *)local_138,(pbVar11->_M_dataplus)._M_p);
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 !=
                   (pcVar6->Languages).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_c0 != (long *)0x0) {
          plVar10 = local_c0;
          do {
            std::operator+(&local_f0,"CMAKE_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar10 + 1));
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
            psVar9 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_160.field_2._M_allocated_capacity = *psVar9;
              local_160.field_2._8_8_ = plVar8[3];
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar9;
              local_160._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_160._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            bVar5 = cmMakefile::IsOn(this->Makefile,&local_160);
            if (bVar5) {
              cmTargetSelectLinker::Consider
                        ((cmTargetSelectLinker *)local_138,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (plVar10 + 1))->_M_dataplus)._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            plVar10 = (long *)*plVar10;
          } while (plVar10 != (long *)0x0);
        }
        cmTargetSelectLinker::Choose_abi_cxx11_(&local_160,(cmTargetSelectLinker *)local_138);
        std::__cxx11::string::operator=((string *)local_140,(string *)&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_120);
      }
      else {
        pcVar2 = (char *)(pLVar4->LinkerLanguage)._M_string_length;
        strlen(pcVar7);
        std::__cxx11::string::_M_replace((ulong)pLVar4,0,pcVar2,(ulong)pcVar7);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)pLVar4,0,(char *)(pLVar4->LinkerLanguage)._M_string_length,0x57b056);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree(&local_98.Visited._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.Config._M_dataplus._M_p != &local_98.Config.field_2) {
      operator_delete(local_98.Config._M_dataplus._M_p,
                      local_98.Config.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_d0);
    return;
  }
  __assert_fail("impl",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x74a,
                "void cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &) const"
               );
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  // Get languages built in this target.
  CM_UNORDERED_SET<std::string> languages;
  cmLinkImplementation const* impl = this->GetLinkImplementation(config);
  assert(impl);
  for (std::vector<std::string>::const_iterator li = impl->Languages.begin();
       li != impl->Languages.end(); ++li) {
    languages.insert(*li);
  }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for (std::vector<cmLinkImplItem>::const_iterator li =
         impl->Libraries.begin();
       li != impl->Libraries.end(); ++li) {
    cll.Visit(*li);
  }

  // Store the transitive closure of languages.
  for (CM_UNORDERED_SET<std::string>::const_iterator li = languages.begin();
       li != languages.end(); ++li) {
    lc.Languages.push_back(*li);
  }

  // Choose the language whose linker should be used.
  if (this->GetProperty("HAS_CXX")) {
    lc.LinkerLanguage = "CXX";
  } else if (const char* linkerLang = this->GetProperty("LINKER_LANGUAGE")) {
    lc.LinkerLanguage = linkerLang;
  } else {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::vector<std::string>::const_iterator li = impl->Languages.begin();
         li != impl->Languages.end(); ++li) {
      tsl.Consider(li->c_str());
    }

    // Now consider languages that propagate from linked targets.
    for (CM_UNORDERED_SET<std::string>::const_iterator sit = languages.begin();
         sit != languages.end(); ++sit) {
      std::string propagates =
        "CMAKE_" + *sit + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(sit->c_str());
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }
}